

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distribution.cpp
# Opt level: O2

void __thiscall
MxxDistribution_DistributeString_Test::~MxxDistribution_DistributeString_Test
          (MxxDistribution_DistributeString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MxxDistribution, DistributeString) {
    mxx::comm c;
    // create unequal distribution
    size_t size = 5 + 7*c.rank();

    auto gen = [](size_t i) {
        char c = static_cast<char>(i % 256);
        if (c == '\0')
            ++c;
        return c;
    };

    test_stable_distribute<std::string>(size, gen, c);

    size = 0;
    if (c.rank() == 0) {
        size = 10*c.size();
    }

    test_stable_distribute<std::string>(size, gen, c);
}